

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O3

void __thiscall CConsole::ExecuteLineStroked(CConsole *this,int Stroke,char *pStr)

{
  char cVar1;
  long lVar2;
  CQueueEntry *pCVar3;
  int iVar4;
  CCommand *pCVar5;
  char *pcVar6;
  ulong uVar7;
  CConsole *pCVar8;
  char *pcVar9;
  long in_FS_OFFSET;
  char aBuf [256];
  CResult Result;
  
  Result.m_apArgs[1] = (char *)0x0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (pStr == (char *)0x0) {
LAB_001b7ba8:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
      __stack_chk_fail();
    }
    return;
  }
LAB_001b79a9:
  if (*pStr != '\0') {
    Result.super_IResult.m_NumArgs = 0;
    Result.super_IResult._vptr_IResult = (_func_int **)&PTR__IResult_00213728;
    mem_zero(Result.m_aStringStorage,0x401);
    Result.m_pArgsStart = (char *)0x0;
    Result.m_pCommand = (char *)0x0;
    pCVar8 = (CConsole *)Result.m_apArgs;
    mem_zero(pCVar8,0x1000);
    pcVar9 = (char *)0x0;
    pcVar6 = pStr;
    do {
      cVar1 = *pcVar6;
      if (cVar1 == '\"') {
        pcVar9 = (char *)(ulong)((uint)pcVar9 ^ 1);
      }
      else if (cVar1 == '\\') {
        if (pcVar6[1] == '\"') {
          pcVar6 = pcVar6 + 1;
        }
      }
      else {
        if (cVar1 == '\0') {
          pcVar9 = (char *)0x0;
          goto LAB_001b7a4b;
        }
        if ((uint)pcVar9 == 0) {
          pcVar9 = (char *)0x0;
          if (cVar1 == '#') goto LAB_001b7a4b;
          if (cVar1 == ';') goto LAB_001b7a47;
        }
        else {
          pcVar9 = (char *)0x1;
        }
      }
      pcVar6 = pcVar6 + 1;
    } while( true );
  }
  goto LAB_001b7ba8;
LAB_001b7a47:
  pcVar9 = pcVar6 + 1;
LAB_001b7a4b:
  ParseStart(pCVar8,&Result,pStr,((int)pcVar6 - (int)pStr) + 1);
  if (*Result.m_pCommand == '\0') goto LAB_001b7ba8;
  pCVar8 = this;
  pCVar5 = FindCommand(this,Result.m_pCommand,this->m_FlagMask);
  if (pCVar5 == (CCommand *)0x0) {
    if (Stroke == 0) goto LAB_001b7b60;
    pcVar6 = "No such command: %s.";
LAB_001b7ad3:
    str_format(aBuf,0x100,pcVar6,Result.m_pCommand);
  }
  else {
    if ((pCVar5->super_CCommandInfo).m_AccessLevel < this->m_AccessLevel) {
      if (Stroke == 0) goto LAB_001b7b60;
      pcVar6 = "Access for command %s denied.";
      goto LAB_001b7ad3;
    }
    if (*Result.m_pCommand == '+') {
      uVar7 = (ulong)Result.super_IResult.m_NumArgs;
      Result.super_IResult.m_NumArgs = Result.super_IResult.m_NumArgs + 1;
      Result.m_apArgs[uVar7] = this->m_paStrokeStr[Stroke];
    }
    else if (Stroke == 0) goto LAB_001b7b60;
    iVar4 = ParseArgs(pCVar8,&Result,(pCVar5->super_CCommandInfo).m_pParams);
    if (iVar4 == 0) {
      if ((this->m_StoreCommands == true) && ((pCVar5->m_Flags & 8) != 0)) {
        CExecutionQueue::AddEntry(&this->m_ExecutionQueue);
        pCVar3 = (this->m_ExecutionQueue).m_pLast;
        pCVar3->m_pCommand = pCVar5;
        CResult::operator=(&pCVar3->m_Result,&Result);
      }
      else {
        (*pCVar5->m_pfnCallback)(&Result.super_IResult,pCVar5->m_pUserData);
      }
      goto LAB_001b7b60;
    }
    str_format(aBuf,0x100,"Invalid arguments... Usage: %s %s",(pCVar5->super_CCommandInfo).m_pName,
               (pCVar5->super_CCommandInfo).m_pParams);
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[0x19])(this,0,"console",aBuf,0);
LAB_001b7b60:
  pStr = pcVar9;
  if (pcVar9 == (char *)0x0) goto LAB_001b7ba8;
  goto LAB_001b79a9;
}

Assistant:

void CConsole::ExecuteLineStroked(int Stroke, const char *pStr)
{
	while(pStr && *pStr)
	{
		CResult Result;
		const char *pEnd = pStr;
		const char *pNextPart = 0;
		int InString = 0;

		while(*pEnd)
		{
			if(*pEnd == '"')
				InString ^= 1;
			else if(*pEnd == '\\') // escape sequences
			{
				if(pEnd[1] == '"')
					pEnd++;
			}
			else if(!InString)
			{
				if(*pEnd == ';') // command separator
				{
					pNextPart = pEnd+1;
					break;
				}
				else if(*pEnd == '#') // comment, no need to do anything more
					break;
			}

			pEnd++;
		}

		if(ParseStart(&Result, pStr, (pEnd-pStr) + 1) != 0)
			return;

		if(!*Result.m_pCommand)
			return;

		CCommand *pCommand = FindCommand(Result.m_pCommand, m_FlagMask);

		if(pCommand)
		{
			if(pCommand->GetAccessLevel() >= m_AccessLevel)
			{
				int IsStrokeCommand = 0;
				if(Result.m_pCommand[0] == '+')
				{
					// insert the stroke direction token
					Result.AddArgument(m_paStrokeStr[Stroke]);
					IsStrokeCommand = 1;
				}

				if(Stroke || IsStrokeCommand)
				{
					if(ParseArgs(&Result, pCommand->m_pParams))
					{
						char aBuf[256];
						str_format(aBuf, sizeof(aBuf), "Invalid arguments... Usage: %s %s", pCommand->m_pName, pCommand->m_pParams);
						Print(OUTPUT_LEVEL_STANDARD, "console", aBuf);
					}
					else if(m_StoreCommands && pCommand->m_Flags&CFGFLAG_STORE)
					{
						m_ExecutionQueue.AddEntry();
						m_ExecutionQueue.m_pLast->m_pCommand = pCommand;
						m_ExecutionQueue.m_pLast->m_Result = Result;
					}
					else
						pCommand->m_pfnCallback(&Result, pCommand->m_pUserData);
				}
			}
			else if(Stroke)
			{
				char aBuf[256];
				str_format(aBuf, sizeof(aBuf), "Access for command %s denied.", Result.m_pCommand);
				Print(OUTPUT_LEVEL_STANDARD, "console", aBuf);
			}
		}
		else if(Stroke)
		{
			char aBuf[256];
			str_format(aBuf, sizeof(aBuf), "No such command: %s.", Result.m_pCommand);
			Print(OUTPUT_LEVEL_STANDARD, "console", aBuf);
		}

		pStr = pNextPart;
	}
}